

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O3

uint8_t * VP8BitWriterFinish(VP8BitWriter *bw)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 1 << (8U - (char)bw->nb_bits_ & 0x1f);
  do {
    VP8PutBitUniform(bw,0);
    bVar1 = 1 < uVar2;
    uVar2 = uVar2 >> 1;
  } while (bVar1);
  bw->nb_bits_ = 0;
  Flush(bw);
  return bw->buf_;
}

Assistant:

uint8_t* VP8BitWriterFinish(VP8BitWriter* const bw) {
  VP8PutBits(bw, 0, 9 - bw->nb_bits_);
  bw->nb_bits_ = 0;   // pad with zeroes
  Flush(bw);
  return bw->buf_;
}